

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

int __thiscall Escape::Graph::copy(Graph *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  newGraph(this,*(VertexIdx *)dst,*(EdgeIdx *)(dst + 8));
  if (*(long *)(dst + 8) != 0) {
    memmove(this->srcs,*(void **)(dst + 0x10),*(long *)(dst + 8) << 3);
    if (*(long *)(dst + 8) != 0) {
      memmove(this->dsts,*(void **)(dst + 0x18),*(long *)(dst + 8) << 3);
    }
  }
  return (int)this;
}

Assistant:

Graph Graph::copy() const {
    Graph ret = newGraph(nVertices, nEdges);
    std::copy(srcs, srcs + nEdges, ret.srcs);
    std::copy(dsts, dsts + nEdges, ret.dsts);
    return ret;
}